

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supercell.hpp
# Opt level: O0

pair<unsigned_long,_Eigen::Matrix<long,__1,_1,_0,__1,_1>_> * __thiscall
lattice::supercell::add_offset(supercell *this,size_t index,offset_t *offset)

{
  bool bVar1;
  unsigned_long *__x;
  Matrix<long,__1,_1,_0,__1,_1> *__y;
  ulong *in_RSI;
  pair<unsigned_long,_Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *in_RDI;
  CoeffReturnType CVar2;
  size_t m;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>,_0>
  p;
  bool checked;
  double eps;
  offset_t crossing;
  offset_t cell;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<long>,_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffffe58;
  supercell *in_stack_fffffffffffffe60;
  Index in_stack_fffffffffffffe68;
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffffe70;
  DenseBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffe78;
  supercell *in_stack_fffffffffffffe80;
  MatrixBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffe88;
  size_t in_stack_fffffffffffffee0;
  supercell *in_stack_fffffffffffffee8;
  ulong local_d0;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe60,
             (size_type)in_stack_fffffffffffffe58);
  lcord2offset(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  Eigen::MatrixBase<Eigen::Matrix<long,-1,1,0,-1,1>>::operator+
            (in_stack_fffffffffffffe88,
             (MatrixBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffe80);
  Eigen::Matrix<long,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<long,long>,Eigen::Matrix<long,_1,1,0,_1,1>const,Eigen::Matrix<long,_1,1,0,_1,1>const>>
            ((Matrix<long,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffe60,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<long,_long>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>_>
              *)in_stack_fffffffffffffe58);
  Eigen::Matrix<long,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<long,__1,_1,_0,__1,_1> *)0x10895c);
  Eigen::DenseBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::Zero(in_stack_fffffffffffffe68);
  Eigen::Matrix<long,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<long>,Eigen::Matrix<long,_1,1,0,_1,1>>>
            ((Matrix<long,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  bVar1 = false;
  while (!bVar1) {
    bVar1 = true;
    Eigen::DenseBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::cast<double>(in_stack_fffffffffffffe78)
    ;
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffe78,
               in_stack_fffffffffffffe70);
    for (local_d0 = 0; local_d0 < *in_RSI; local_d0 = local_d0 + 1) {
      CVar2 = Eigen::
              DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>,_0>,_0>
              ::operator()((DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>,_0>,_0>
                            *)in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
      if (-1e-08 <= CVar2) {
        in_stack_fffffffffffffe78 =
             (DenseBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *)
             Eigen::
             DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>,_0>,_0>
             ::operator()((DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>,_0>,_0>
                           *)in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
        if (0.99999999 < (double)in_stack_fffffffffffffe78) {
          bVar1 = false;
          Eigen::DenseBase<Eigen::Matrix<long,_-1,_-1,_0,_-1,_-1>_>::col
                    ((DenseBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffe70
                     ,in_stack_fffffffffffffe68);
          Eigen::MatrixBase<Eigen::Matrix<long,-1,1,0,-1,1>>::operator-=
                    ((MatrixBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffe80,
                     (MatrixBase<Eigen::Block<const_Eigen::Matrix<long,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                      *)in_stack_fffffffffffffe78);
          in_stack_fffffffffffffe70 =
               (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>_>
                *)Eigen::DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_1> *)
                             in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
          *(long *)in_stack_fffffffffffffe70 = *(long *)in_stack_fffffffffffffe70 + 1;
        }
      }
      else {
        bVar1 = false;
        Eigen::DenseBase<Eigen::Matrix<long,_-1,_-1,_0,_-1,_-1>_>::col
                  ((DenseBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffe70,
                   in_stack_fffffffffffffe68);
        Eigen::MatrixBase<Eigen::Matrix<long,-1,1,0,-1,1>>::operator+=
                  ((MatrixBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffe80,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<long,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                    *)in_stack_fffffffffffffe78);
        in_stack_fffffffffffffe80 =
             (supercell *)
             Eigen::DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
        in_stack_fffffffffffffe80->dim_ = in_stack_fffffffffffffe80->dim_ - 1;
      }
    }
  }
  __x = (unsigned_long *)
        offset2lcord(in_stack_fffffffffffffe80,(offset_t *)in_stack_fffffffffffffe78);
  __y = (Matrix<long,__1,_1,_0,__1,_1> *)
        lcord2index(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
  std::make_pair<unsigned_long,Eigen::Matrix<long,_1,1,0,_1,1>&>(__x,__y);
  Eigen::Matrix<long,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<long,__1,_1,_0,__1,_1> *)0x108c3f);
  Eigen::Matrix<long,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<long,__1,_1,_0,__1,_1> *)0x108c4c);
  return in_RDI;
}

Assistant:

std::pair<std::size_t, offset_t> add_offset(std::size_t index, const offset_t& offset) const {
    offset_t cell = lcord2offset(index2lcord_.at(index)) + offset;
    offset_t crossing = offset_t::Zero(dim_);
    const double eps = 1.0e-8;
    bool checked = false;
    while (!checked) {
      checked = true;
      auto p = rs_ * cell.cast<double>();
      for (std::size_t m = 0; m < dim_; ++m) {
        if (p(m) < -eps) {
          checked = false;
          cell += span_.col(m);
          crossing(m) -= 1;
        } else if (p(m) > (1.0 - eps)) {
          checked = false;
          cell -= span_.col(m);
          crossing(m) += 1;
        }
      }
    }
    return std::make_pair(lcord2index(offset2lcord(cell)), crossing);
  }